

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::scanPotentialInterfaces
          (Connector *this,ConnectionsList *possibleConnections)

{
  bool bVar1;
  reference ppVar2;
  _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
  *in_RSI;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *pEnd;
  iterator __end2_2;
  iterator __begin2_2;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *__range2_2;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *pPub;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *__range2_1;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *pInp;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *__range2;
  Connector *in_stack_000000b8;
  undefined1 in_stack_000000c0 [16];
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
  *in_stack_000000e0;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_000000e8;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *in_stack_ffffffffffffff48;
  _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
  *in_stack_ffffffffffffff50;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  local_88;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  local_80;
  _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
  *local_78;
  size_t local_70;
  char *local_68;
  reference local_60;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  local_58;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  local_50;
  _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
  *local_48;
  size_t local_40;
  char *local_38;
  reference local_30;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
  local_20;
  _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
  *local_18;
  _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
  *local_10;
  
  local_18 = in_RSI + 0x2f;
  local_10 = in_RSI;
  local_20._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
       ::begin(in_stack_ffffffffffffff48);
  local_28._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
       ::end(in_stack_ffffffffffffff48);
  while (bVar1 = CLI::std::__detail::operator==(&local_20,&local_28), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_30 = CLI::std::__detail::
               _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
                            *)0x1f35a1);
    local_40 = (local_30->first)._M_len;
    local_38 = (local_30->first)._M_str;
    in_stack_ffffffffffffff48 =
         (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
          *)(local_10 + 0x60);
    in_stack_ffffffffffffff50 = local_10;
    bVar1 = checkPotentialConnection
                      (in_stack_000000b8,(string_view)in_stack_000000c0,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
                       (unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)possibleConnections,__range2,in_stack_000000e0,in_stack_000000e8);
    if (bVar1) {
      (local_30->second).used = true;
    }
    CLI::std::__detail::
    _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
    ::operator++(in_stack_ffffffffffffff50);
  }
  local_48 = local_10 + 0x28;
  local_50._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
       ::begin(in_stack_ffffffffffffff48);
  local_58._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
       ::end(in_stack_ffffffffffffff48);
  while (bVar1 = CLI::std::__detail::operator==(&local_50,&local_58), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_60 = CLI::std::__detail::
               _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
                            *)0x1f36a4);
    if (((local_60->second).used & 1U) == 0) {
      local_70 = (local_60->first)._M_len;
      local_68 = (local_60->first)._M_str;
      in_stack_ffffffffffffff48 =
           (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
            *)(local_10 + 99);
      in_stack_ffffffffffffff50 = local_10;
      bVar1 = checkPotentialConnection
                        (in_stack_000000b8,(string_view)in_stack_000000c0,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
                         (unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)possibleConnections,__range2,in_stack_000000e0,in_stack_000000e8);
      if (bVar1) {
        (local_60->second).used = true;
      }
    }
    CLI::std::__detail::
    _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
    ::operator++(in_stack_ffffffffffffff50);
  }
  local_78 = local_10 + 0x36;
  local_80._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
       ::begin(in_stack_ffffffffffffff48);
  local_88._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
       ::end(in_stack_ffffffffffffff48);
  while (bVar1 = CLI::std::__detail::operator==(&local_80,&local_88), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = CLI::std::__detail::
             _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
             ::operator*((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
                          *)0x1f37a5);
    if ((((ppVar2->second).used & 1U) == 0) &&
       (in_stack_ffffffffffffff50 = local_10,
       bVar1 = checkPotentialConnection
                         (in_stack_000000b8,(string_view)in_stack_000000c0,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,
                          (unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)possibleConnections,__range2,in_stack_000000e0,in_stack_000000e8),
       bVar1)) {
      (ppVar2->second).used = true;
    }
    CLI::std::__detail::
    _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_false,_true>
    ::operator++(in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void Connector::scanPotentialInterfaces(ConnectionsList& possibleConnections)
{
    /** potential inputs*/
    for (auto& pInp : possibleConnections.potentialInputs) {
        if (checkPotentialConnection(pInp.first,
                                     possibleConnections.tagCodes,
                                     possibleConnections.pubs,
                                     possibleConnections.potentialPubs,
                                     possibleConnections.potentialPublicationTemplates,
                                     possibleConnections.aliases)) {
            pInp.second.used = true;
        }
    }
    /* potential publications*/
    for (auto& pPub : possibleConnections.potentialPubs) {
        if (pPub.second.used) {
            continue;
        }
        if (checkPotentialConnection(pPub.first,
                                     possibleConnections.tagCodes,
                                     possibleConnections.inputs,
                                     possibleConnections.potentialInputs,
                                     possibleConnections.potentialInputTemplates,
                                     possibleConnections.aliases)) {
            pPub.second.used = true;
        }
    }

    /* potential endpoints*/
    for (auto& pEnd : possibleConnections.potentialEndpoints) {
        if (pEnd.second.used) {
            continue;
        }
        if (checkPotentialConnection(pEnd.first,
                                     possibleConnections.tagCodes,
                                     possibleConnections.endpoints,
                                     possibleConnections.potentialEndpoints,
                                     possibleConnections.potentialEndpointTemplates,
                                     possibleConnections.aliases)) {
            pEnd.second.used = true;
        }
    }
}